

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_doors.cpp
# Opt level: O0

bool EV_DoDoor(EVlDoor type,line_t_conflict *line,AActor *thing,int tag,double speed,int delay,
              int lock,int lightTag,bool boomgen,int topcountdown)

{
  AActor *ent;
  bool bVar1;
  DSectorEffect *this;
  DSeqNode *curseq;
  DDoor *pDVar2;
  size_t sVar3;
  FSectorTagIterator local_6c;
  FSectorTagIterator it;
  DDoor *door;
  sector_t_conflict *local_48;
  sector_t *sec;
  int secnum;
  bool rtn;
  int iStack_34;
  bool boomgen_local;
  int lock_local;
  int delay_local;
  double speed_local;
  AActor *pAStack_20;
  int tag_local;
  AActor *thing_local;
  line_t_conflict *line_local;
  EVlDoor type_local;
  
  sec._7_1_ = boomgen;
  sec._6_1_ = 0;
  secnum = lock;
  iStack_34 = delay;
  _lock_local = speed;
  speed_local._4_4_ = tag;
  pAStack_20 = thing;
  thing_local = (AActor *)line;
  line_local._0_4_ = type;
  if ((lock != 0) && (bVar1 = P_CheckKeys(thing,lock,tag != 0), !bVar1)) {
    return false;
  }
  ent = pAStack_20;
  if (speed_local._4_4_ == 0) {
    if (thing_local == (AActor *)0x0) {
      return false;
    }
    if ((thing_local->__Pos).Y == 0.0) {
      FSoundID::FSoundID((FSoundID *)((long)&door + 4),"*usefail");
      S_Sound(ent,2,(FSoundID *)((long)&door + 4),1.0,1.0);
      return false;
    }
    local_48 = *(sector_t_conflict **)(thing_local->__Pos).Y;
    sec._0_4_ = (int)(((long)local_48 - (long)sectors) / 0x218);
    sVar3 = 1;
    bVar1 = sector_t::PlaneMoving((sector_t *)local_48,1);
    if (bVar1) {
      if ((sec._7_1_ & 1) != 0) {
        return false;
      }
      this = TObjPtr<DSectorEffect>::operator->(&local_48->ceilingdata);
      bVar1 = DObject::IsKindOf((DObject *)this,DDoor::RegistrationInfo.MyClass);
      if (((bVar1) &&
          (pDVar2 = barrier_cast<DDoor*,DSectorEffect>(&local_48->ceilingdata),
          pDVar2->m_Type == doorRaise)) && ((EVlDoor)line_local == doorRaise)) {
        if (pDVar2->m_Direction != -1) {
          if ((*(uint *)&(thing_local->super_DThinker).super_DObject.field_0x24 & 0x210) != 0) {
            return false;
          }
          if ((pAStack_20->player != (player_t *)0x0) &&
             (bVar1 = TObjPtr<DBot>::operator!=(&pAStack_20->player->Bot,(DBot *)0x0), !bVar1)) {
            pDVar2->m_Direction = -1;
            curseq = SN_CheckSequence((sector_t *)local_48,2);
            DDoor::DoorSound(pDVar2,false,curseq);
            return true;
          }
          return false;
        }
        pDVar2->m_Direction = 1;
        DDoor::DoorSound(pDVar2,true,(DSeqNode *)0x0);
      }
      return false;
    }
    pDVar2 = (DDoor *)DObject::operator_new((DObject *)0x88,sVar3);
    DDoor::DDoor(pDVar2,(sector_t *)local_48,(EVlDoor)line_local,_lock_local,iStack_34,lightTag,
                 topcountdown);
    if (pDVar2 != (DDoor *)0x0) {
      sec._6_1_ = 1;
    }
  }
  else {
    FSectorTagIterator::FSectorTagIterator(&local_6c,speed_local._4_4_);
    while (sec._0_4_ = FSectorTagIterator::Next(&local_6c), -1 < (int)sec) {
      local_48 = sectors + (int)sec;
      sVar3 = 1;
      bVar1 = sector_t::PlaneMoving((sector_t *)local_48,1);
      if (!bVar1) {
        pDVar2 = (DDoor *)DObject::operator_new((DObject *)0x88,sVar3);
        DDoor::DDoor(pDVar2,(sector_t *)local_48,(EVlDoor)line_local,_lock_local,iStack_34,lightTag,
                     topcountdown);
        if (pDVar2 != (DDoor *)0x0) {
          sec._6_1_ = 1;
        }
      }
    }
  }
  return (bool)(sec._6_1_ & 1);
}

Assistant:

bool EV_DoDoor (DDoor::EVlDoor type, line_t *line, AActor *thing,
				int tag, double speed, int delay, int lock, int lightTag, bool boomgen, int topcountdown)
{
	bool		rtn = false;
	int 		secnum;
	sector_t*	sec;

	if (lock != 0 && !P_CheckKeys (thing, lock, tag != 0))
		return false;

	if (tag == 0)
	{		// [RH] manual door
		if (!line)
			return false;

		// if the wrong side of door is pushed, give oof sound
		if (line->sidedef[1] == NULL)			// killough
		{
			S_Sound (thing, CHAN_VOICE, "*usefail", 1, ATTN_NORM);
			return false;
		}

		// get the sector on the second side of activating linedef
		sec = line->sidedef[1]->sector;
		secnum = int(sec-sectors);

		// if door already has a thinker, use it
		if (sec->PlaneMoving(sector_t::ceiling))
		{
			// Boom used remote door logic for generalized doors, even if they are manual
			if (boomgen)
				return false;
			if (sec->ceilingdata->IsKindOf (RUNTIME_CLASS(DDoor)))
			{
				DDoor *door = barrier_cast<DDoor *>(sec->ceilingdata);

				// ONLY FOR "RAISE" DOORS, NOT "OPEN"s
				if (door->m_Type == DDoor::doorRaise && type == DDoor::doorRaise)
				{
					if (door->m_Direction == -1)
					{
						door->m_Direction = 1;	// go back up
						door->DoorSound (true);	// [RH] Make noise
					}
					else if (!(line->activation & (SPAC_Push|SPAC_MPush)))
						// [RH] activate push doors don't go back down when you
						//		run into them (otherwise opening them would be
						//		a real pain).
					{
						if (!thing->player || thing->player->Bot != NULL)
							return false;	// JDC: bad guys never close doors
											//Added by MC: Neither do bots.

						door->m_Direction = -1;	// start going down immediately

						// Start the door close sequence.
						door->DoorSound(false, SN_CheckSequence(sec, CHAN_CEILING));
						return true;
					}
					else
					{
						return false;
					}
				}
			}
			return false;
		}
		if (new DDoor (sec, type, speed, delay, lightTag, topcountdown))
			rtn = true;
	}
	else
	{	// [RH] Remote door

		FSectorTagIterator it(tag);
		while ((secnum = it.Next()) >= 0)
		{
			sec = &sectors[secnum];
			// if the ceiling is already moving, don't start the door action
			if (sec->PlaneMoving(sector_t::ceiling))
				continue;

			if (new DDoor (sec, type, speed, delay, lightTag, topcountdown))
				rtn = true;
		}
				
	}
	return rtn;
}